

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall
FpgaIO::PromWriteBlock25AA128(FpgaIO *this,uint16_t addr,quadlet_t *data,uint nquads,uchar chan)

{
  BasePort *pBVar1;
  int iVar2;
  ostream *poVar3;
  nodeaddr_t nVar4;
  undefined6 in_register_00000032;
  PromType type;
  
  if (nquads - 0x11 < 0xfffffff0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"invalid number of quadlets");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    type = PROM_25AA128_1;
    if (chan != '\x01') {
      type = (uint)(chan == '\x02') * 2 + PROM_25AA128;
    }
    nVar4 = GetPromAddress(this,type,true);
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x27])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4 | 0x100,data,
                       (ulong)(nquads * 4));
    if ((char)iVar2 != '\0') {
      PromWriteEnable(this,type);
      pBVar1 = (this->super_BoardIO).port;
      iVar2 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4,
                         (ulong)(nquads - 1 | (int)CONCAT62(in_register_00000032,addr) << 8 |
                                0xff000000));
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool FpgaIO::PromWriteBlock25AA128(uint16_t addr, quadlet_t *data, unsigned int nquads,
                                   unsigned char chan)
{
    // address sanity check
    if (nquads == 0 || nquads > 16) {
        std::cout << "invalid number of quadlets" << std::endl;
        return false;
    }

    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;
    nodeaddr_t address = GetPromAddress(prom_type, true);

    // block write data to buffer
    if (!port->WriteBlock(BoardId, (address|0x0100), data, nquads*sizeof(quadlet_t)))
        return false;

    // enable write
    PromWriteEnable(prom_type);

    // trigger write
    quadlet_t write_data = 0xFF000000|(addr << 8)|(nquads-1);
    return port->WriteQuadlet(BoardId, address, write_data);
}